

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdg.c
# Opt level: O0

char * strip_slash(char *str)

{
  size_t sVar1;
  bool bVar2;
  char *local_28;
  char *s;
  size_t size;
  char *str_local;
  
  if ((str == (char *)0x0) || (sVar1 = strlen(str), sVar1 == 0)) {
    str_local = (char *)0x0;
  }
  else {
    local_28 = str + sVar1;
    while( true ) {
      local_28 = local_28 + -1;
      bVar2 = false;
      if (str <= local_28) {
        bVar2 = *local_28 == '/';
      }
      str_local = str;
      if (!bVar2) break;
      *local_28 = '\0';
    }
  }
  return str_local;
}

Assistant:

static inline char*
strip_slash(char *str)
{
   // if you get invalid read of size 4 here with valgrind
   // it means that you compiled with O2 or higher optimizations on gcc
   // gcc has builtin optimized strlen that reads bytes in aligned chunks

   size_t size;
   if (!str || !(size = strlen(str)))
      return NULL;

   for (char *s = str + size - 1; s >= str && *s == '/'; --s)
      *s = 0;

   return str;
}